

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManCountMapRefs(Lf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  Tim_Man_t *pTVar2;
  undefined8 uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Obj_t *pObj;
  int *piVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  
  pGVar10 = p->pGia;
  pVVar12 = pGVar10->vCos;
  if (pVVar12->nSize < 1) {
    uVar8 = 0;
  }
  else {
    lVar14 = 0;
    uVar8 = 0;
    do {
      iVar6 = pVVar12->pArray[lVar14];
      if (((long)iVar6 < 0) || (pGVar10->nObjs <= iVar6)) goto LAB_006d70b6;
      uVar5 = Lf_ObjCoArrival2_rec
                        (p,pGVar10->pObjs + iVar6 +
                           -(ulong)((uint)*(undefined8 *)(pGVar10->pObjs + iVar6) & 0x1fffffff));
      if ((int)uVar8 <= (int)uVar5) {
        uVar8 = uVar5;
      }
      lVar14 = lVar14 + 1;
      pGVar10 = p->pGia;
      pVVar12 = pGVar10->vCos;
    } while (lVar14 < pVVar12->nSize);
  }
  pJVar1 = p->pPars;
  if ((pJVar1->DelayTarget == -1) && (pJVar1->nRelaxRatio != 0)) {
    pJVar1->DelayTarget =
         (int)((((double)pJVar1->nRelaxRatio + 100.0) * (double)(int)uVar8) / 100.0);
  }
  uVar5 = pJVar1->DelayTarget;
  uVar13 = uVar8;
  if (((uVar5 != 0xffffffff) && (uVar13 = uVar5, (double)(int)uVar5 + 0.01 <= (double)(int)uVar8))
     && (uVar13 = uVar8, pJVar1->nRelaxRatio == 0)) {
    Abc_Print(0,"Relaxing user-specified delay target from %d to %d.\n",(ulong)uVar5,(ulong)uVar8);
  }
  pJVar1 = p->pPars;
  pJVar1->Delay = (long)(int)uVar13;
  p->Switches = 0.0;
  pJVar1->Mux7 = 0;
  pJVar1->Area = 0;
  pJVar1->Edge = 0;
  uVar8 = p->pGia->nObjs;
  if ((p->vRequired).nCap < (int)uVar8) {
    piVar9 = (p->vRequired).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar8 << 2);
    }
    (p->vRequired).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequired).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    piVar9 = (p->vRequired).pArray;
    uVar11 = 0;
    do {
      piVar9[uVar11] = 1000000000;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  (p->vRequired).nSize = uVar8;
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  pTVar2 = (Tim_Man_t *)p->pGia->pManTime;
  if (pTVar2 == (Tim_Man_t *)0x0) {
    pGVar10 = p->pGia;
    pVVar12 = pGVar10->vCos;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        iVar6 = pVVar12->pArray[lVar14];
        lVar15 = (long)iVar6;
        if ((lVar15 < 0) || (pGVar10->nObjs <= iVar6)) goto LAB_006d70b6;
        uVar5 = (uint)*(undefined8 *)(pGVar10->pObjs + lVar15);
        uVar8 = uVar13;
        if (p->pPars->fDoAverage != 0) {
          iVar7 = Lf_ObjArrival_rec(p,pGVar10->pObjs + (lVar15 - (ulong)(uVar5 & 0x1fffffff)));
          uVar8 = (uint)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar7) / 100.0);
        }
        uVar5 = iVar6 - (uVar5 & 0x1fffffff);
        if (((int)uVar5 < 0) || ((p->vRequired).nSize <= (int)uVar5)) goto LAB_006d70d5;
        piVar9 = (p->vRequired).pArray;
        if ((int)uVar8 < piVar9[uVar5]) {
          piVar9[uVar5] = uVar8;
        }
        lVar14 = lVar14 + 1;
        pGVar10 = p->pGia;
        pVVar12 = pGVar10->vCos;
      } while (lVar14 < pVVar12->nSize);
    }
    lVar14 = (long)pGVar10->nObjs;
    if (1 < lVar14) {
      lVar15 = lVar14 + 1;
      lVar14 = lVar14 * 3;
      do {
        lVar16 = lVar15 + -1;
        if (p->pGia->nObjs < lVar16) goto LAB_006d70b6;
        pGVar4 = p->pGia->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar3 = *(undefined8 *)(&pGVar4[-1].field_0x0 + lVar14 * 4);
        uVar8 = (uint)uVar3;
        if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
          if ((((int)uVar8 < 0) || (uVar8 = uVar8 & 0x1fffffff, uVar8 == 0x1fffffff)) ||
             (uVar8 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
            if ((p->vOffsets).nSize < lVar16) goto LAB_006d70d5;
            iVar6 = (p->vOffsets).pArray[lVar15 + -2];
            if (((long)iVar6 < 0) || ((p->vMapRefs).nSize <= iVar6)) goto LAB_006d70d5;
            if ((p->vMapRefs).pArray[iVar6] != 0) {
              Lf_ManCountMapRefsOne(p,(int)lVar15 + -2);
            }
          }
          else {
            iVar6 = (p->vRequired).nSize;
            if (iVar6 < lVar16) goto LAB_006d70d5;
            uVar11 = ((ulong)-uVar8 + lVar15) - 2;
            iVar7 = (int)uVar11;
            if ((iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_006d70d5;
            piVar9 = (p->vRequired).pArray;
            uVar11 = uVar11 & 0xffffffff;
            if (piVar9[lVar15 + -2] < piVar9[uVar11]) {
              piVar9[uVar11] = piVar9[lVar15 + -2];
            }
          }
        }
        lVar15 = lVar16;
        lVar14 = lVar14 + -3;
      } while (2 < lVar16);
    }
  }
  else {
    Tim_ManIncrementTravId(pTVar2);
    pGVar10 = p->pGia;
    if (p->pPars->fDoAverage == 0) {
      Tim_ManInitPoRequiredAll((Tim_Man_t *)pGVar10->pManTime,(float)(int)uVar13);
    }
    else {
      pVVar12 = pGVar10->vCos;
      if (0 < pVVar12->nSize) {
        lVar14 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar14];
          if (((long)iVar6 < 0) || (pGVar10->nObjs <= iVar6)) goto LAB_006d70b6;
          pTVar2 = (Tim_Man_t *)pGVar10->pManTime;
          iVar6 = Lf_ObjArrival_rec(p,pGVar10->pObjs + iVar6 +
                                      -(ulong)((uint)*(undefined8 *)(pGVar10->pObjs + iVar6) &
                                              0x1fffffff));
          Tim_ManSetCoRequired
                    (pTVar2,(int)lVar14,
                     (float)(int)((((double)p->pPars->nRelaxRatio + 100.0) * (double)iVar6) / 100.0)
                    );
          lVar14 = lVar14 + 1;
          pGVar10 = p->pGia;
          pVVar12 = pGVar10->vCos;
        } while (lVar14 < pVVar12->nSize);
      }
    }
    lVar14 = (long)p->pGia->nObjs;
    if (1 < lVar14) {
      lVar15 = lVar14 + 1;
      lVar14 = lVar14 * 3;
      do {
        lVar16 = lVar15 + -1;
        pGVar10 = p->pGia;
        if (pGVar10->nObjs < lVar16) {
LAB_006d70b6:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar4 = pGVar10->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar11 = *(ulong *)(&pGVar4[-1].field_0x0 + lVar14 * 4);
        uVar5 = (uint)(uVar11 >> 0x20) & 0x1fffffff;
        uVar8 = (uint)uVar11;
        if ((((int)uVar8 < 0) || (uVar13 = uVar8 & 0x1fffffff, uVar13 == 0x1fffffff)) ||
           (uVar13 != uVar5)) {
          if ((uVar11 & 0x1fffffff) == 0x1fffffff || (int)uVar8 < 0) {
            if ((~uVar8 & 0x9fffffff) == 0) {
              if (-1 < (int)uVar8) {
                __assert_fail("pObj->fTerm",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
              }
              if ((p->vRequired).nSize < lVar16) goto LAB_006d70d5;
              Tim_ManSetCiRequired
                        ((Tim_Man_t *)pGVar10->pManTime,uVar5,
                         (float)(p->vRequired).pArray[lVar15 + -2]);
            }
            else {
              if ((-1 < (int)uVar8) || ((int)(uVar11 & 0x1fffffff) == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                              ,0x668,"void Lf_ManCountMapRefs(Lf_Man_t *)");
              }
              fVar17 = Tim_ManGetCoRequired((Tim_Man_t *)pGVar10->pManTime,uVar5);
              uVar11 = ((ulong)-(*(uint *)(&pGVar4[-1].field_0x0 + lVar14 * 4) & 0x1fffffff) +
                       lVar15) - 2;
              iVar6 = (int)uVar11;
              if ((iVar6 < 0) || ((p->vRequired).nSize <= iVar6)) goto LAB_006d70d5;
              piVar9 = (p->vRequired).pArray;
              uVar11 = uVar11 & 0xffffffff;
              if ((int)fVar17 < piVar9[uVar11]) {
                piVar9[uVar11] = (int)fVar17;
              }
            }
          }
          else {
            if ((p->vOffsets).nSize < lVar16) {
LAB_006d70d5:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar6 = (p->vOffsets).pArray[lVar15 + -2];
            if (((long)iVar6 < 0) || ((p->vMapRefs).nSize <= iVar6)) goto LAB_006d70d5;
            if ((p->vMapRefs).pArray[iVar6] != 0) {
              Lf_ManCountMapRefsOne(p,(int)lVar15 + -2);
            }
          }
        }
        else {
          iVar6 = (p->vRequired).nSize;
          if (iVar6 < lVar16) goto LAB_006d70d5;
          uVar11 = (lVar15 + (ulong)-uVar13) - 2;
          iVar7 = (int)uVar11;
          if ((iVar7 < 0) || (iVar6 <= iVar7)) goto LAB_006d70d5;
          piVar9 = (p->vRequired).pArray;
          uVar11 = uVar11 & 0xffffffff;
          if (piVar9[lVar15 + -2] < piVar9[uVar11]) {
            piVar9[uVar11] = piVar9[lVar15 + -2];
          }
        }
        lVar15 = lVar16;
        lVar14 = lVar14 + -3;
      } while (2 < lVar16);
    }
  }
  if (p->pPars->fUseMux7 == 0) {
    return;
  }
  Gia_ManCleanMark0(p->pGia);
  return;
}

Assistant:

void Lf_ManCountMapRefs( Lf_Man_t * p )
{
    // compute delay
    Gia_Obj_t * pObj;
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Delay = Abc_MaxInt( Delay, Lf_ObjCoArrival2(p, i) );
    // check delay target
    if ( p->pPars->DelayTarget == -1 && p->pPars->nRelaxRatio )
        p->pPars->DelayTarget = (int)((float)Delay * (100.0 + p->pPars->nRelaxRatio) / 100.0);
    if ( p->pPars->DelayTarget != -1 )
    {
        if ( Delay < p->pPars->DelayTarget + 0.01 )
            Delay = p->pPars->DelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %d to %d.\n", p->pPars->DelayTarget, Delay );
    }
    p->pPars->Delay = Delay;
    // compute area/edges/required
    p->pPars->Mux7 = p->pPars->Area = p->pPars->Edge = p->Switches = 0;
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(p->pGia), ABC_INFINITY );
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
    if ( p->pGia->pManTime != NULL )
    {
        Tim_ManIncrementTravId( (Tim_Man_t*)p->pGia->pManTime );
        if ( p->pPars->fDoAverage )
            for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
               Tim_ManSetCoRequired( (Tim_Man_t*)p->pGia->pManTime, i, (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) );
        else  
            Tim_ManInitPoRequiredAll( (Tim_Man_t*)p->pGia->pManTime, Delay );
        Gia_ManForEachObjReverse1( p->pGia, pObj, i )
        {
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Lf_ObjMapRefNum(p, i) )
                    Lf_ManCountMapRefsOne( p, i );
            }
            else if ( Gia_ObjIsCi(pObj) )
                Tim_ManSetCiRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsCo(pObj) )
            {
                int reqTime = Tim_ManGetCoRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj) );
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), reqTime );
            }
            else assert( 0 );
        }
    }
    else
    {
        Gia_ManForEachCoDriverId( p->pGia, Id, i )
            Lf_ObjSetRequired( p, Id, p->pPars->fDoAverage ? (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) : Delay );
        Gia_ManForEachAndReverse( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Lf_ObjMapRefNum(p, i) )
                Lf_ManCountMapRefsOne( p, i );
    }
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
}